

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O3

double cfgfile::format_t<double,_cfgfile::qstring_trait_t>::from_string
                 (parser_info_t<cfgfile::qstring_trait_t> *info,string_t *value)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  logic_error *this;
  bool ok;
  string local_1c8;
  qstring_wrapper_t local_1a8;
  undefined8 local_188;
  string local_180;
  string_t local_160;
  string_t local_148;
  string_t local_130;
  string_t local_118;
  string_t local_100;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_d0;
  qstring_wrapper_t local_b8;
  qstring_wrapper_t local_a0;
  qstring_wrapper_t local_88;
  string local_70;
  string local_50;
  
  local_1c8._M_dataplus._M_p = (pointer)(value->m_str).d.d;
  local_1c8._M_string_length = (size_type)(value->m_str).d.ptr;
  local_1c8.field_2._M_allocated_capacity = (value->m_str).d.size;
  if ((QArrayData *)local_1c8._M_dataplus._M_p != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_1c8._M_dataplus._M_p)->ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((QArrayData *)local_1c8._M_dataplus._M_p)->ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uVar1 = QString::toDouble((bool *)&local_1c8);
  if ((QArrayData *)local_1c8._M_dataplus._M_p != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_1c8._M_dataplus._M_p = *(int *)local_1c8._M_dataplus._M_p + -1;
    UNLOCK();
    if (*(int *)local_1c8._M_dataplus._M_p == 0) {
      local_188 = uVar1;
      QArrayData::deallocate((QArrayData *)local_1c8._M_dataplus._M_p,2,8);
    }
  }
  this = (logic_error *)__cxa_allocate_exception(0x28);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"Invalid value: \"","");
  qstring_trait_t::from_ascii(&local_100,&local_1c8);
  operator+(&local_e8,&local_100,value);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_118,&local_50);
  operator+(&local_d0,&local_e8,&local_118);
  operator+(&local_b8,&local_d0,&info->m_file_name);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\" on line ","");
  qstring_trait_t::from_ascii(&local_130,&local_70);
  operator+(&local_a0,&local_b8,&local_130);
  qstring_trait_t::to_string(&local_148,info->m_line_number);
  operator+(&local_88,&local_a0,&local_148);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,".","");
  qstring_trait_t::from_ascii(&local_160,&local_180);
  operator+(&local_1a8,&local_88,&local_160);
  std::logic_error::logic_error(this,"Please use desc() method of the exception.");
  *(undefined ***)this = &PTR__exception_t_00141d28;
  *(undefined8 *)(this + 0x20) = 0;
  uVar2 = local_1a8.m_str.d.d._0_4_;
  uVar3 = local_1a8.m_str.d.d._4_4_;
  local_1a8.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this + 0x10) = uVar2;
  *(undefined4 *)(this + 0x14) = uVar3;
  *(undefined4 *)(this + 0x18) = local_1a8.m_str.d.ptr._0_4_;
  *(undefined4 *)(this + 0x1c) = local_1a8.m_str.d.ptr._4_4_;
  local_1a8.m_str.d.ptr = (char16_t *)0x0;
  *(qsizetype *)(this + 0x20) = local_1a8.m_str.d.size;
  local_1a8.m_str.d.size = 0;
  __cxa_throw(this,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

static double from_string( const parser_info_t< qstring_trait_t > & info,
		const qstring_trait_t::string_t & value )
	{
		bool ok = false;
		double result = ((QString)value).toDouble( &ok );

		if( !ok )
			throw exception_t< qstring_trait_t >(
				qstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + qstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				qstring_trait_t::from_ascii( "\" on line " ) +
				qstring_trait_t::to_string( info.line_number() ) +
				qstring_trait_t::from_ascii( "." ) );
		else
			return result;
	}